

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveOut::out<int>
          (ChArchiveOut *this,ChNameValue<std::vector<int,_std::allocator<int>_>_> *bVal)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  ChValueSpecific<std::vector<int,_std::allocator<int>_>_> specVal;
  char buffer [20];
  char *local_98;
  long local_90;
  undefined1 local_88;
  ChValueSpecific<std::vector<int,_std::allocator<int>_>_> local_80;
  char local_48 [24];
  
  ChValueSpecific<std::vector<int,_std::allocator<int>_>_>::ChValueSpecific
            (&local_80,bVal->_value,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])
            (this,&local_80,
             (long)(bVal->_value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(bVal->_value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  lVar1 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(bVal->_value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(bVal->_value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    sprintf(local_48,"%lu",uVar2);
    local_90 = (long)(bVal->_value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar1;
    local_88 = 0;
    local_98 = local_48;
    (*(this->super_ChArchive)._vptr_ChArchive[3])(this,&local_98);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])
              (this,&local_80,
               (long)(bVal->_value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(bVal->_value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    lVar1 = lVar1 + 4;
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,&local_80);
  ChValue::~ChValue(&local_80.super_ChValue);
  return;
}

Assistant:

void out     (ChNameValue< std::vector<T> > bVal) {
          ChValueSpecific< std::vector<T> > specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre( specVal, bVal.value().size());
          for (size_t i = 0; i<bVal.value().size(); ++i)
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< T > array_val(buffer, bVal.value()[i]);
              this->out (array_val);
              this->out_array_between(specVal, bVal.value().size());
          }
          this->out_array_end(specVal, bVal.value().size());
      }